

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint in_ESI;
  float *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  bool in_stack_00000027;
  char *in_stack_00000028;
  char buf [64];
  int ca;
  int cb;
  int cg;
  int cr;
  ImGuiColorEditFlags opts;
  ImGuiContext *g;
  bool allow_opt_datatype;
  bool allow_opt_inputs;
  undefined4 in_stack_ffffffffffffff08;
  int iVar9;
  ImGuiPopupFlags in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiWindowFlags in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  float local_c4;
  int local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  char local_78 [68];
  int local_34;
  uint local_30;
  uint local_2c;
  ImGuiContext *size_arg;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar10;
  undefined1 selected;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  uVar10 = (CONCAT13((in_ESI & 0x700000) != 0,in_stack_fffffffffffffff0) ^ 0xff000000) & 0x1ffffff;
  uVar10 = (CONCAT13((char)(uVar10 >> 0x18),CONCAT12((in_ESI & 0x1800000) != 0,(short)uVar10)) ^
           0xff0000) & 0xff01ffff;
  if ((((char)(uVar10 >> 0x18) != '\0') || ((char)(uVar10 >> 0x10) != '\0')) &&
     (bVar2 = BeginPopup(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14), bVar2)) {
    uVar3 = GImGui->ColorEditOptions;
    size_arg = GImGui;
    if ((uVar10 & 0x1000000) != 0) {
      bVar2 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar2) {
        uVar3 = uVar3 & 0xff8fffff | 0x100000;
      }
      bVar2 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar2) {
        uVar3 = uVar3 & 0xff8fffff | 0x200000;
      }
      bVar2 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar2) {
        uVar3 = uVar3 & 0xff8fffff | 0x400000;
      }
    }
    if ((uVar10 & 0x10000) != 0) {
      if ((uVar10 & 0x1000000) != 0) {
        Separator();
      }
      bVar2 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar2) {
        uVar3 = uVar3 & 0xfe7fffff | 0x800000;
      }
      bVar2 = RadioButton(in_stack_00000028,in_stack_00000027);
      if (bVar2) {
        uVar3 = uVar3 & 0xfe7fffff | 0x1000000;
      }
    }
    if (((uVar10 & 0x1000000) != 0) || ((uVar10 & 0x10000) != 0)) {
      Separator();
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffdc,-1.0,0.0);
    bVar2 = Button((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar2) {
      OpenPopup((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                in_stack_ffffffffffffff0c);
    }
    bVar2 = BeginPopup(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    if (bVar2) {
      auVar5._0_4_ = ImSaturate(*in_RDI);
      auVar5._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar5._0_16_,
                               SUB6416(ZEXT464(0x3f000000),0));
      uVar4 = (uint)auVar1._0_4_;
      auVar6._0_4_ = ImSaturate(in_RDI[1]);
      auVar6._4_60_ = extraout_var_00;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar6._0_16_,
                               SUB6416(ZEXT464(0x3f000000),0));
      local_2c = (uint)auVar1._0_4_;
      auVar7._0_4_ = ImSaturate(in_RDI[2]);
      auVar7._4_60_ = extraout_var_01;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar7._0_16_,
                               SUB6416(ZEXT464(0x3f000000),0));
      local_30 = (uint)auVar1._0_4_;
      if ((in_ESI & 2) == 0) {
        auVar8._0_4_ = ImSaturate(in_RDI[3]);
        auVar8._4_60_ = extraout_var_02;
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar8._0_16_,
                                 SUB6416(ZEXT464(0x3f000000),0));
        local_9c = (int)auVar1._0_4_;
      }
      else {
        local_9c = 0xff;
      }
      local_34 = local_9c;
      if ((in_ESI & 2) == 0) {
        local_c4 = in_RDI[3];
      }
      else {
        local_c4 = 1.0;
      }
      ImFormatString((char *)(double)*in_RDI,(size_t)(double)in_RDI[1],(char *)(double)in_RDI[2],
                     (double)local_c4,local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)");
      ImVec2::ImVec2(&local_80,0.0,0.0);
      bVar2 = Selectable((char *)in_RDI,SUB41(in_ESI >> 0x18,0),uVar10,(ImVec2 *)size_arg);
      if (bVar2) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      iVar9 = local_34;
      ImFormatString(local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar4,(ulong)local_2c,(ulong)local_30,
                     local_34);
      ImVec2::ImVec2(&local_88,0.0,0.0);
      bVar2 = Selectable((char *)in_RDI,SUB41(in_ESI >> 0x18,0),uVar10,(ImVec2 *)size_arg);
      if (bVar2) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      ImFormatString(local_78,0x40,"#%02X%02X%02X",(ulong)uVar4,(ulong)local_2c,(ulong)local_30,
                     iVar9);
      ImVec2::ImVec2(&local_90,0.0,0.0);
      bVar2 = Selectable((char *)in_RDI,SUB41(in_ESI >> 0x18,0),uVar10,(ImVec2 *)size_arg);
      if (bVar2) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      if ((in_ESI & 2) == 0) {
        ImFormatString(local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar4,(ulong)local_2c,
                       (ulong)local_30,local_34);
        selected = (undefined1)(in_ESI >> 0x18);
        ImVec2::ImVec2(&local_98,0.0,0.0);
        bVar2 = Selectable((char *)in_RDI,(bool)selected,uVar10,(ImVec2 *)size_arg);
        if (bVar2) {
          SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        }
      }
      EndPopup();
    }
    size_arg->ColorEditOptions = uVar3;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags_DisplayMask_);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags_DataTypeMask_);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}